

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet_encoding.h
# Opt level: O0

void ximu::PacketEncoding::
     encodePacket<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                src,size_t count,
               back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
               dest)

{
  value_type vVar1;
  ulong uVar2;
  iterator iVar3;
  reference pvVar4;
  byte *pbVar5;
  uint local_94;
  uint idx;
  allocator<unsigned_char> local_72;
  value_type local_71;
  undefined1 local_70 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> shiftRegister;
  allocator<unsigned_char> local_42;
  value_type local_41;
  undefined1 local_40 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> encodedPacket;
  uint uStack_20;
  uint encodedLength;
  size_t count_local;
  back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_> dest_local;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  src_local;
  
  if (count != 0) {
    uStack_20 = (uint)count;
    encodedPacket.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = encodedPacketSize(uStack_20);
    uVar2 = (ulong)encodedPacket.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    local_41 = '\0';
    std::allocator<unsigned_char>::allocator(&local_42);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,uVar2,&local_41,
               &local_42);
    std::allocator<unsigned_char>::~allocator(&local_42);
    uVar2 = (ulong)encodedPacket.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_;
    local_71 = '\0';
    std::allocator<unsigned_char>::allocator(&local_72);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,uVar2,&local_71,
               &local_72);
    std::allocator<unsigned_char>::~allocator(&local_72);
    iVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
    std::
    copy_n<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_long,__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              (src,count,
               (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )iVar3._M_current);
    for (local_94 = 0;
        local_94 !=
        encodedPacket.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage._4_4_; local_94 = local_94 + 1) {
      rightShiftBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,
                          (ulong)local_94);
      vVar1 = *pvVar4;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40,
                          (ulong)local_94);
      *pvVar4 = vVar1;
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,
                          (ulong)local_94);
      *pvVar4 = '\0';
    }
    pbVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::back
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    *pbVar5 = *pbVar5 | 0x80;
    iVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
    std::
    copy_n<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,unsigned_int,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
              ((__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                )iVar3._M_current,
               encodedPacket.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,dest);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_40);
  }
  return;
}

Assistant:

static void encodePacket(InputIterator src, size_t count,
                           OutputIterator dest) {
    // need at least one byte to encode 
    if (count < 1)
      return;

    // calculate new message length
    unsigned encodedLength = encodedPacketSize(count);
    std::vector<unsigned char> encodedPacket(encodedLength, 0);
    std::vector<unsigned char> shiftRegister(encodedLength, 0);
    
    // fill the shift register
    std::copy_n(src, count, shiftRegister.begin());

    // shift
    for (unsigned idx = 0; idx != encodedLength; ++idx) {
      rightShiftBytes(shiftRegister);           // r-shift clear msb i
      encodedPacket[idx] = shiftRegister[idx];  // store encoded byte
      shiftRegister[idx] = 0;                   // clear byte from sr
    }
    // set msb of framing byte
    encodedPacket.back() |= 0x80;
    std::copy_n(encodedPacket.begin(), encodedLength, dest);
  }